

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O3

Transaction * __thiscall
duckdb::DuckTransactionManager::StartTransaction
          (DuckTransactionManager *this,ClientContext *context)

{
  ulong start_time;
  transaction_t transaction_id;
  pointer puVar1;
  int iVar2;
  MetaTransaction *pMVar3;
  tuple<std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_> tVar4;
  DuckTransaction *this_00;
  type pDVar5;
  InternalException *this_01;
  pointer __p;
  unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>,_true>
  start_lock;
  __uniq_ptr_impl<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
  local_58;
  string local_50;
  
  pMVar3 = TransactionContext::ActiveTransaction(&context->transaction);
  local_58._M_t.
  super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
  .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
       (tuple<std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>)
       (_Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
        )0x0;
  if (pMVar3->is_read_only == false) {
    tVar4.
    super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
    .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
          )operator_new(8);
    *(mutex **)
     tVar4.
     super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
     .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
         &this->start_transaction_lock;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->start_transaction_lock);
    if (iVar2 != 0) {
      ::std::__throw_system_error(iVar2);
    }
    local_50._M_dataplus._M_p = (pointer)0x0;
    local_58._M_t.
    super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
    .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
         (tuple<std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>)
         (tuple<std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>)
         tVar4.
         super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
         .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl;
    ::std::
    unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>::
    ~unique_ptr((unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
                 *)&local_50);
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->transaction_lock);
  if (iVar2 == 0) {
    start_time = this->current_start_timestamp;
    if (start_time < 0x4000000000000060) {
      this->current_start_timestamp = start_time + 1;
      transaction_id = this->current_transaction_id;
      puVar1 = (this->active_transactions).
               super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this->current_transaction_id = transaction_id + 1;
      if (puVar1 == (this->active_transactions).
                    super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        LOCK();
        (this->lowest_active_start).super___atomic_base<unsigned_long>._M_i = start_time;
        UNLOCK();
        LOCK();
        (this->lowest_active_id).super___atomic_base<unsigned_long>._M_i = transaction_id;
        UNLOCK();
      }
      this_00 = (DuckTransaction *)operator_new(400);
      DuckTransaction::DuckTransaction
                (this_00,this,context,start_time,transaction_id,this->last_committed_version);
      local_50._M_dataplus._M_p = (pointer)this_00;
      pDVar5 = unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
               ::operator*((unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                            *)&local_50);
      ::std::
      vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>
                ((vector<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,std::default_delete<duckdb::DuckTransaction>,true>>>
                  *)&this->active_transactions,
                 (unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>
                  *)&local_50);
      if ((DuckTransaction *)local_50._M_dataplus._M_p != (DuckTransaction *)0x0) {
        (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->transaction_lock);
      ::std::
      unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>::
      ~unique_ptr((unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
                   *)&local_58);
      return &pDVar5->super_Transaction;
    }
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "Cannot start more transactions, ran out of transaction identifiers!","");
    InternalException::InternalException(this_01,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

Transaction &DuckTransactionManager::StartTransaction(ClientContext &context) {
	// obtain the transaction lock during this function
	auto &meta_transaction = MetaTransaction::Get(context);
	unique_ptr<lock_guard<mutex>> start_lock;
	if (!meta_transaction.IsReadOnly()) {
		start_lock = make_uniq<lock_guard<mutex>>(start_transaction_lock);
	}
	lock_guard<mutex> lock(transaction_lock);
	if (current_start_timestamp >= TRANSACTION_ID_START) { // LCOV_EXCL_START
		throw InternalException("Cannot start more transactions, ran out of "
		                        "transaction identifiers!");
	} // LCOV_EXCL_STOP

	// obtain the start time and transaction ID of this transaction
	transaction_t start_time = current_start_timestamp++;
	transaction_t transaction_id = current_transaction_id++;
	if (active_transactions.empty()) {
		lowest_active_start = start_time;
		lowest_active_id = transaction_id;
	}

	// create the actual transaction
	auto transaction = make_uniq<DuckTransaction>(*this, context, start_time, transaction_id, last_committed_version);
	auto &transaction_ref = *transaction;

	// store it in the set of active transactions
	active_transactions.push_back(std::move(transaction));
	return transaction_ref;
}